

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O0

void array_run_container_union(array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  _Bool _Var2;
  run_container_t *in_RDX;
  run_container_t *in_RSI;
  int *in_RDI;
  rle16_t previousrle;
  int32_t arraypos;
  int32_t rlepos;
  run_container_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  rle16_t local_24;
  int local_20;
  int local_1c;
  
  _Var2 = run_container_is_full(in_RSI);
  if (_Var2) {
    run_container_copy((run_container_t *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  }
  else {
    run_container_grow(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
    local_1c = 0;
    local_20 = 0;
    if (**(ushort **)(in_RDI + 2) < in_RSI->runs->value) {
      local_24 = run_container_append_value_first(in_RDX,**(uint16_t **)(in_RDI + 2));
      local_20 = local_20 + 1;
    }
    else {
      local_24 = run_container_append_first(in_RDX,*in_RSI->runs);
      local_1c = local_1c + 1;
    }
    while( true ) {
      bVar1 = false;
      if (local_1c < in_RSI->n_runs) {
        bVar1 = local_20 < *in_RDI;
      }
      if (!bVar1) break;
      if (*(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 2) < in_RSI->runs[local_1c].value) {
        run_container_append_value
                  (in_RDX,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_20 * 2),&local_24);
        local_20 = local_20 + 1;
      }
      else {
        run_container_append(in_RDX,in_RSI->runs[local_1c],&local_24);
        local_1c = local_1c + 1;
      }
    }
    if (local_20 < *in_RDI) {
      for (; local_20 < *in_RDI; local_20 = local_20 + 1) {
        run_container_append_value
                  (in_RDX,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_20 * 2),&local_24);
      }
    }
    else {
      for (; local_1c < in_RSI->n_runs; local_1c = local_1c + 1) {
        run_container_append(in_RDX,in_RSI->runs[local_1c],&local_24);
      }
    }
  }
  return;
}

Assistant:

void array_run_container_union(const array_container_t *src_1,
                               const run_container_t *src_2,
                               run_container_t *dst) {
    if (run_container_is_full(src_2)) {
        run_container_copy(src_2, dst);
        return;
    }
    // TODO: see whether the "2*" is spurious
    run_container_grow(dst, 2 * (src_1->cardinality + src_2->n_runs), false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t previousrle;
    if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(dst, src_2->runs[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(dst, src_1->array[arraypos]);
        arraypos++;
    }
    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src_2->n_runs) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        }
    }
}